

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Sfm_DecPrint(Sfm_Dec_t *p,word (*Masks) [8])

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  char *pcVar5;
  Mio_Gate_t *pGate;
  char *pcVar6;
  word *p_01;
  Vec_Int_t *vLevel;
  int Entry;
  int k;
  int i;
  int c;
  word (*Masks_local) [8];
  Sfm_Dec_t *p_local;
  
  for (k = 0; k < 2; k = k + 1) {
    p_00 = Vec_WecEntry(&p->vObjFanins,p->iTarget);
    pcVar5 = "ON";
    if (k != 0) {
      pcVar5 = "OFF";
    }
    uVar2 = p->iTarget;
    uVar4 = p->nDivs;
    iVar1 = Vec_IntEntry(&p->vObjGates,p->iTarget);
    pGate = (Mio_Gate_t *)Vec_PtrEntry(&p->vGateHands,iVar1);
    pcVar6 = Mio_GateReadName(pGate);
    printf("%s-SET of object %d (divs = %d) with gate \"%s\" and fanins: ",pcVar5,(ulong)uVar2,
           (ulong)uVar4,pcVar6);
    for (Entry = 0; iVar1 = Vec_IntSize(p_00), Entry < iVar1; Entry = Entry + 1) {
      uVar2 = Vec_IntEntry(p_00,Entry);
      printf("%d ",(ulong)uVar2);
    }
    printf("\n");
    printf("Implications: ");
    for (Entry = 0; iVar1 = Vec_IntSize(p->vImpls + k), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(p->vImpls + k,Entry);
      iVar3 = Abc_LitIsCompl(iVar1);
      pcVar5 = "";
      if (iVar3 != 0) {
        pcVar5 = "!";
      }
      uVar2 = Abc_Lit2Var(iVar1);
      uVar4 = Sfm_DecFindCost(p,k,iVar1,Masks[(int)(uint)((k != 0 ^ 0xffU) & 1)]);
      printf("%s%d(%d) ",pcVar5,(ulong)uVar2,(ulong)uVar4);
    }
    printf("\n");
    printf("     ");
    for (Entry = 0; Entry < p->nDivs; Entry = Entry + 1) {
      printf("%d",(long)((ulong)(uint)((int)((long)Entry / 10) >> 0x1f) << 0x20 |
                        (long)Entry / 10 & 0xffffffffU) % 10 & 0xffffffff);
    }
    printf("\n");
    printf("     ");
    for (Entry = 0; Entry < p->nDivs; Entry = Entry + 1) {
      printf("%d",(long)Entry % 10 & 0xffffffff);
    }
    printf("\n");
    for (vLevel._4_4_ = 0; (int)vLevel._4_4_ < p->nPats[k]; vLevel._4_4_ = vLevel._4_4_ + 1) {
      printf("%2d : ",(ulong)vLevel._4_4_);
      for (Entry = 0; Entry < p->nDivs; Entry = Entry + 1) {
        p_01 = Sfm_DecDivPats(p,Entry,k);
        uVar2 = Abc_TtGetBit(p_01,vLevel._4_4_);
        printf("%d",(ulong)uVar2);
      }
      printf("\n");
    }
  }
  return;
}

Assistant:

void Sfm_DecPrint( Sfm_Dec_t * p, word Masks[2][SFM_SIM_WORDS] )
{
    int c, i, k, Entry;
    for ( c = 0; c < 2; c++ )
    {
        Vec_Int_t * vLevel = Vec_WecEntry( &p->vObjFanins, p->iTarget );
        printf( "%s-SET of object %d (divs = %d) with gate \"%s\" and fanins: ", 
            c ? "OFF": "ON", p->iTarget, p->nDivs, 
            Mio_GateReadName((Mio_Gate_t *)Vec_PtrEntry(&p->vGateHands, Vec_IntEntry(&p->vObjGates,p->iTarget))) );
        Vec_IntForEachEntry( vLevel, Entry, i )
            printf( "%d ", Entry );
        printf( "\n" );

        printf( "Implications: " );
        Vec_IntForEachEntry( &p->vImpls[c], Entry, i )
            printf( "%s%d(%d) ", Abc_LitIsCompl(Entry)? "!":"", Abc_Lit2Var(Entry), Sfm_DecFindCost(p, c, Entry, Masks[!c]) );
        printf( "\n" );
        printf( "     " );
        for ( i = 0; i < p->nDivs; i++ )
            printf( "%d", (i / 10) % 10 );
        printf( "\n" );
        printf( "     " );
        for ( i = 0; i < p->nDivs; i++ )
            printf( "%d", i % 10 );
        printf( "\n" );
        for ( k = 0; k < p->nPats[c]; k++ )
        {
            printf( "%2d : ", k );
            for ( i = 0; i < p->nDivs; i++ )
                printf( "%d", Abc_TtGetBit(Sfm_DecDivPats(p, i, c), k) );
            printf( "\n" );
        }
        //printf( "\n" );
    }
}